

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR DSK_directorynamep(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  DLword *pDVar4;
  size_t x;
  LispPTR local_20b4;
  ulong local_20b0;
  ulong local_20a0;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  LispPTR *lf_naddress;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  char *base;
  long lStack_2020;
  int fatp;
  size_t len;
  char fullname [4096];
  char dirname [4096];
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      lStack_2020 = (long)(int)pLVar2[2];
      base._4_4_ = 0;
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      lStack_2020 = (long)(int)(pLVar2[2] << 1);
      base._4_4_ = 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (base._4_4_ == 0) {
      local_20b0 = lStack_2020 + 3;
    }
    else {
      local_20b0 = lStack_2020 + 5;
    }
    if (local_20b0 < 0xfff) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_20b4 = pLVar2[2];
      }
      else {
        local_20b4 = 0x1000;
      }
      pLVar3 = (LispPTR *)(long)(int)local_20b4;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(fullname + 0xff8);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < pLVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (fullname + 0xff8)[(long)pLVar3] = '\0';
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(fullname + 0xff8);
        for (lf_naddress = (LispPTR *)0x0; lf_naddress < pLVar3;
            lf_naddress = (LispPTR *)((long)lf_naddress + 1)) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      iVar1 = unixpathname(fullname + 0xff8,(char *)&len,1,0);
      if (iVar1 == 0) {
        args_local._4_4_ = 0;
      }
      else {
        iVar1 = true_name((char *)&len);
        if (iVar1 == -1) {
          iVar1 = lisppathname((char *)&len,fullname + 0xff8,1,0);
          if (iVar1 == 0) {
            args_local._4_4_ = 0;
          }
          else {
            x = strlen(fullname + 0xff8);
            pLVar2 = NativeAligned4FromLAddr(args[1]);
            lf_i_1 = (size_t)NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
            lf_dptr_1 = fullname + 0xff8;
            for (local_20a0 = 0; local_20a0 < x + 1; local_20a0 = local_20a0 + 1) {
              *(char *)(lf_i_1 ^ 3) = *lf_dptr_1;
              lf_i_1 = lf_i_1 + 1;
              lf_dptr_1 = lf_dptr_1 + 1;
            }
            args_local._4_4_ = GetPosSmallp(x);
          }
        }
        else {
          args_local._4_4_ = 0;
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR DSK_directorynamep(LispPTR *args)
{
  char dirname[MAXPATHLEN];
  char fullname[MAXPATHLEN];
  size_t len;
  int fatp;
  char *base;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringLength(args[0], len, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  len = fatp ? len + 4 + 1 : len + 2 + 1;
  /* -2 for the initial and trail directory delimiter. */
  if (len > MAXPATHLEN - 2) FileNameTooLong(NIL);

  LispStringToCString(args[0], dirname, MAXPATHLEN);

/* Convert Xerox Lisp file naming convention to Unix one. */
#ifdef DOS
  separate_drive(dirname, drive);
  if (unixpathname(dirname, fullname, 1, 0, drive, 0, 0) == 0) return (NIL);
#else  /* DOS*/
  if (unixpathname(dirname, fullname, 1, 0) == 0) return (NIL);
#endif /* DOS */

  if (true_name(fullname) != -1) return (NIL);

  /* Convert Unix file naming convention to Xerox Lisp one. */
  if (lisppathname(fullname, dirname, 1, 0) == 0) return (NIL);

  len = strlen(dirname);
  STRING_BASE(args[1], base);

#ifndef BYTESWAP
  strncpy(base, dirname, len + 1);
#else
  StrNCpyFromCToLisp(base, dirname, len + 1);
#endif /* BYTESWAP */

  return (GetPosSmallp(len));
}